

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogManager.cpp
# Opt level: O2

void liblogger::LogManager::FilterAdd(ILogFilter *filter)

{
  LogManagerScopedLock lock;
  shared_ptr<liblogger::ILogFilter> ptr;
  LogManagerScopedLock local_29;
  __shared_ptr<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2> local_28;
  __shared_ptr<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2> local_18;
  
  Lock();
  local_29.m_locked = true;
  std::__shared_ptr<liblogger::ILogFilter,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<liblogger::ILogFilter,void>
            ((__shared_ptr<liblogger::ILogFilter,(__gnu_cxx::_Lock_policy)2> *)&local_28,filter);
  std::__shared_ptr<liblogger::ILogFilter,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_18,&local_28);
  FilterAdd((shared_ptr<liblogger::ILogFilter> *)&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_18._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  LogManagerScopedLock::~LogManagerScopedLock(&local_29);
  return;
}

Assistant:

void LogManager::FilterAdd(ILogFilter *filter)
{
	LogManagerScopedLock lock = LogManagerScopedLock();
	std::shared_ptr<ILogFilter> ptr(filter);
	FilterAdd(ptr);
}